

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator __thiscall
QHash<VcsolutionDepend*,QList<QString>>::emplace_helper<QList<QString>const&>
          (QHash<VcsolutionDepend_*,_QList<QString>_> *this,VcsolutionDepend **key,
          QList<QString> *args)

{
  long lVar1;
  piter it;
  piter pVar2;
  iterator<QHashPrivate::Node<VcsolutionDepend_*,_QList<QString>_>_> *in_RDX;
  Data<QHashPrivate::Node<VcsolutionDepend_*,_QList<QString>_>_> *in_RSI;
  long in_FS_OFFSET;
  InsertionResult result;
  iterator *in_stack_ffffffffffffff88;
  Data<QHashPrivate::Node<VcsolutionDepend_*,_QList<QString>_>_> *in_stack_ffffffffffffff90;
  size_t in_stack_ffffffffffffff98;
  undefined8 local_30;
  undefined8 local_28;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QHashPrivate::Data<QHashPrivate::Node<VcsolutionDepend*,QList<QString>>>::
  findOrInsert<VcsolutionDepend*>(in_RSI,(VcsolutionDepend **)in_RDX);
  QHashPrivate::iterator<QHashPrivate::Node<VcsolutionDepend_*,_QList<QString>_>_>::node(in_RDX);
  QHashPrivate::Node<VcsolutionDepend*,QList<QString>>::createInPlace<QList<QString>const&>
            ((Node<VcsolutionDepend_*,_QList<QString>_> *)in_stack_ffffffffffffff90,
             (VcsolutionDepend **)in_stack_ffffffffffffff88,(QList<QString> *)0x2a1143);
  it.bucket = in_stack_ffffffffffffff98;
  it.d = in_stack_ffffffffffffff90;
  QHash<VcsolutionDepend_*,_QList<QString>_>::iterator::iterator(in_stack_ffffffffffffff88,it);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  pVar2.bucket = local_28;
  pVar2.d = local_30;
  return (iterator)pVar2;
}

Assistant:

iterator emplace_helper(Key &&key, Args &&... args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->emplaceValue(std::forward<Args>(args)...);
        return iterator(result.it);
    }